

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::set_paging<4>
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this)

{
  CardState CVar1;
  CardState *pCVar2;
  uint8_t *local_40;
  uint8_t *local_38;
  reference local_30;
  uint8_t *local_28;
  CardState state;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this_local;
  
  pCVar2 = AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>_>
           ::card_state(&this->auxiliary_switches_);
  CVar1 = *pCVar2;
  if (((uint)CVar1 & 1) == 0) {
    local_28 = (uint8_t *)0x0;
  }
  else {
    local_28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->rom_,0)
    ;
  }
  page(this,0xc1,0xc4,local_28,(uint8_t *)0x0);
  if (((uint)CVar1 & 0x100) == 0) {
    local_30 = (reference)0x0;
  }
  else {
    local_30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->rom_,0x200);
  }
  this->read_pages_[0xc3] = local_30;
  if (((uint)CVar1 & 0x10000) == 0) {
    local_38 = (uint8_t *)0x0;
  }
  else {
    local_38 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->rom_,0x300);
  }
  page(this,0xc4,200,local_38,(uint8_t *)0x0);
  if (((uint)CVar1 & 0x1000000) == 0) {
    local_40 = (uint8_t *)0x0;
  }
  else {
    local_40 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->rom_,0x700);
  }
  page(this,200,0xd0,local_40,(uint8_t *)0x0);
  return;
}

Assistant:

void set_paging() {
			if constexpr (bool(type & PagingType::ZeroPage)) {
				if(auxiliary_switches_.zero_state()) {
					write_pages_[0] = aux_ram_;
				} else {
					write_pages_[0] = ram_;
				}
				write_pages_[1] = write_pages_[0] + 256;
				read_pages_[0] = write_pages_[0];
				read_pages_[1] = write_pages_[1];
			}

			if constexpr (bool(type & (PagingType::LanguageCard | PagingType::ZeroPage))) {
				const auto language_state = language_card_.state();
				const auto zero_state = auxiliary_switches_.zero_state();

				uint8_t *const ram = zero_state ? aux_ram_ : ram_;
				uint8_t *const rom = is_iie(model) ? &rom_[3840] : rom_.data();

				// Which way the region here is mapped to be banks 1 and 2 is
				// arbitrary.
				page(0xd0, 0xe0,
					language_state.read ? &ram[language_state.bank2 ? 0xd000 : 0xc000] : rom,
					language_state.write ? nullptr : &ram[language_state.bank2 ? 0xd000 : 0xc000]);

				page(0xe0, 0x100,
					language_state.read ? &ram[0xe000] : &rom[0x1000],
					language_state.write ? nullptr : &ram[0xe000]);
			}

			if constexpr (bool(type & PagingType::CardArea)) {
				const auto state = auxiliary_switches_.card_state();

				page(0xc1, 0xc4, state.region_C1_C3 ? &rom_[0xc100 - 0xc100] : nullptr, nullptr);
				read_pages_[0xc3] = state.region_C3 ? &rom_[0xc300 - 0xc100] : nullptr;
				page(0xc4, 0xc8, state.region_C4_C8 ? &rom_[0xc400 - 0xc100] : nullptr, nullptr);
				page(0xc8, 0xd0, state.region_C8_D0 ? &rom_[0xc800 - 0xc100] : nullptr, nullptr);
			}

			if constexpr (bool(type & PagingType::Main)) {
				const auto state = auxiliary_switches_.main_state();

				page(0x02, 0x04,
					state.base.read ? &aux_ram_[0x0200] : &ram_[0x0200],
					state.base.write ? &aux_ram_[0x0200] : &ram_[0x0200]);
				page(0x08, 0x20,
					state.base.read ? &aux_ram_[0x0800] : &ram_[0x0800],
					state.base.write ? &aux_ram_[0x0800] : &ram_[0x0800]);
				page(0x40, 0xc0,
					state.base.read ? &aux_ram_[0x4000] : &ram_[0x4000],
					state.base.write ? &aux_ram_[0x4000] : &ram_[0x4000]);

				page(0x04, 0x08,
					state.region_04_08.read ? &aux_ram_[0x0400] : &ram_[0x0400],
					state.region_04_08.write ? &aux_ram_[0x0400] : &ram_[0x0400]);

				page(0x20, 0x40,
					state.region_20_40.read ? &aux_ram_[0x2000] : &ram_[0x2000],
					state.region_20_40.write ? &aux_ram_[0x2000] : &ram_[0x2000]);
			}
		}